

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int pager_shared_lock(Pager *pPager)

{
  unqlite_file **ppOut;
  byte *pbVar1;
  unqlite_file *puVar2;
  _func_int_unqlite_file_ptr *p_Var3;
  _func_int_unqlite_kv_engine_ptr_pgno *p_Var4;
  uint3 uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  sxu32 sVar9;
  int iVar10;
  sxi32 sVar11;
  uchar *pSrc;
  pgno pVar12;
  unqlite_kv_methods *pMethods;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  pgno pVar16;
  char *pcVar17;
  unqlite *pDb;
  sxu32 nByte;
  ulong local_230;
  uchar zRaw [512];
  
  if (pPager->iState != 0) {
    return 0;
  }
  ppOut = &pPager->pfd;
  iVar7 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,ppOut,pPager->iOpenFlags);
  if (iVar7 != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while opening the target database file: %s",pPager->zFilename);
    return iVar7;
  }
  iVar7 = pager_wait_on_lock(pPager,1);
  if (iVar7 == -0xe) {
    unqliteGenError(pPager->pDb,
                    "Another process or thread have a reserved or exclusive lock on this database");
    return -0xe;
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  if ((pPager->iLock < 2) && (iVar7 = pager_journal_rollback(pPager,1), iVar7 != 0)) {
    return iVar7;
  }
  local_230 = 0;
  iVar7 = (*(*ppOut)->pMethods->xFileSize)(*ppOut,(unqlite_int64 *)&local_230);
  if (iVar7 != 0) {
    return iVar7;
  }
  pPager->dbByteSize = local_230;
  if ((long)local_230 < 1) {
    puVar2 = *ppOut;
    uVar14 = 0x200;
    if ((puVar2 != (unqlite_file *)0x0) &&
       (p_Var3 = puVar2->pMethods->xSectorSize, p_Var3 != (_func_int_unqlite_file_ptr *)0x0)) {
      uVar8 = (*p_Var3)(puVar2);
      uVar15 = 0x10000;
      if (uVar8 < 0x10000) {
        uVar15 = uVar8;
      }
      uVar14 = 0x200;
      if (0x1f < (int)uVar8) {
        uVar14 = uVar15;
      }
    }
    pPager->iSectorSize = uVar14;
    nByte = 0x1000;
    if (0xffff01fe < sUnqlMPGlobal.iPageSize - 0x10001U) {
      nByte = sUnqlMPGlobal.iPageSize;
    }
    pPager->iPageSize = nByte;
    pcVar17 = pPager->pEngine->pIo->pMethods->zName;
    (pPager->sKv).zString = pcVar17;
    sVar9 = SyStrlen(pcVar17);
    (pPager->sKv).nByte = sVar9;
    pPager->dbSize = 0;
LAB_00115182:
    pSrc = (uchar *)SyMemBackendAlloc(pPager->pAllocator,nByte);
    pPager->zTmpPage = pSrc;
    if (pSrc == (uchar *)0x0) {
      iVar7 = -1;
      unqliteGenOutofMem(pPager->pDb);
    }
    else {
      SyZero(pSrc,pPager->iPageSize);
      if (((pPager->dbSize != 0) && ((pPager->iOpenFlags & 0x100) != 0)) &&
         (iVar7 = UnixVfs_Mmap(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize), iVar7 != 0)) {
        unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
        pbVar1 = (byte *)((long)&pPager->iOpenFlags + 1);
        *pbVar1 = *pbVar1 & 0xfe;
      }
      pPager->iState = 1;
      p_Var4 = pPager->pEngine->pIo->pMethods->xOpen;
      iVar7 = 0;
      if ((p_Var4 != (_func_int_unqlite_kv_engine_ptr_pgno *)0x0) &&
         (iVar10 = (*p_Var4)(pPager->pEngine,pPager->dbSize), iVar10 != 0)) {
        unqliteGenErrorFormat
                  (pPager->pDb,"xOpen() method of the underlying KV engine \'%z\' failed",
                   &pPager->sKv);
        pager_unlock_db(pPager,0);
        pPager->iState = 0;
        iVar7 = iVar10;
      }
    }
  }
  else {
    if (local_230 < 0x200) {
      unqliteGenError(pPager->pDb,"Malformed database image");
      return -0x18;
    }
    iVar7 = (*(*ppOut)->pMethods->xRead)(*ppOut,zRaw,0x200,0);
    if (iVar7 == 0) {
      sVar11 = SyMemcmp("unqlite",zRaw,7);
      pcVar17 = "Malformed database image";
      iVar7 = -0x18;
      if ((sVar11 == 0) &&
         (((uint)zRaw._7_4_ >> 0x18 | (zRaw._7_4_ & 0xff0000) >> 8 | (zRaw._7_4_ & 0xff00) << 8 |
          zRaw._7_4_ << 0x18) == 0xdb7c2712)) {
        SyDosTimeFormat((uint)zRaw._11_4_ >> 0x18 | (zRaw._11_4_ & 0xff0000) >> 8 |
                        (zRaw._11_4_ & 0xff00) << 8 | zRaw._11_4_ << 0x18,&pPager->tmCreate);
        uVar5 = CONCAT12(zRaw[0x10],zRaw._17_2_ << 8 | (ushort)zRaw._17_2_ >> 8);
        uVar14 = CONCAT13(zRaw[0xf],uVar5);
        pPager->iSectorSize = uVar14;
        uVar15 = (uint)zRaw._19_4_ >> 0x18 | (zRaw._19_4_ & 0xff0000) >> 8 |
                 (zRaw._19_4_ & 0xff00) << 8 | zRaw._19_4_ << 0x18;
        pPager->iPageSize = uVar15;
        if ((0x1ff < (int)uVar15) &&
           (((0xffff001e < uVar14 - 0x10001 && (uVar15 < 0x10001)) &&
            ((uVar5 + 0x1ffff & uVar14) == 0)))) {
          uVar6 = zRaw._23_2_ << 8 | (ushort)zRaw._23_2_ >> 8;
          uVar13 = 0x1e7;
          if (uVar6 < 0x1e7) {
            uVar13 = uVar6;
          }
          pcVar17 = (char *)SyMemBackendDup(pPager->pAllocator,zRaw + 0x19,(uint)uVar13);
          if (pcVar17 != (char *)0x0) {
            (pPager->sKv).zString = pcVar17;
            (pPager->sKv).nByte = (uint)uVar13;
            pVar12 = (long)local_230 / (long)pPager->iPageSize;
            pVar16 = 1;
            if (pVar12 != 0) {
              pVar16 = pVar12;
            }
            if ((long)local_230 < 1) {
              pVar16 = pVar12;
            }
            pPager->dbSize = pVar16;
            pMethods = unqliteFindKVStore(pcVar17,(uint)uVar13);
            if (pMethods == (unqlite_kv_methods *)0x0) {
              unqliteGenErrorFormat
                        (pPager->pDb,"No such Key/Value storage engine \'%z\'",&pPager->sKv);
              return -0x11;
            }
            iVar7 = unqlitePagerRegisterKvEngine(pPager,pMethods);
            if (iVar7 != 0) {
              return iVar7;
            }
            nByte = pPager->iPageSize;
            goto LAB_00115182;
          }
          pcVar17 = "Unqlite is running out of memory";
          iVar7 = -1;
        }
      }
      pDb = pPager->pDb;
    }
    else {
      pDb = pPager->pDb;
      pcVar17 = "IO error while reading database header";
    }
    unqliteGenError(pDb,pcVar17);
  }
  return iVar7;
}

Assistant:

static int pager_shared_lock(Pager *pPager)
{
	int rc = UNQLITE_OK;
	if( pPager->iState == PAGER_OPEN ){
		unqlite_kv_methods *pMethods;
		/* Open the target database */
		rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,&pPager->pfd,pPager->iOpenFlags);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pPager->pDb,
				"IO error while opening the target database file: %s",pPager->zFilename
				);
			return rc;
		}
		/* Try to obtain a shared lock */
		rc = pager_wait_on_lock(pPager,SHARED_LOCK);
		if( rc == UNQLITE_OK ){
			if( pPager->iLock <= SHARED_LOCK ){
				/* Rollback any hot journal */
				rc = pager_journal_rollback(pPager,1);
				if( rc != UNQLITE_OK ){
					return rc;
				}
			}
			/* Read the database header */
			rc = pager_read_db_header(pPager);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			if(pPager->dbSize > 0 ){
				if( pPager->iOpenFlags & UNQLITE_OPEN_MMAP ){
					const jx9_vfs *pVfs = jx9ExportBuiltinVfs();
					/* Obtain a read-only memory view of the whole file */
					if( pVfs && pVfs->xMmap ){
						int vr;
						vr = pVfs->xMmap(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize);
						if( vr != JX9_OK ){
							/* Generate a warning */
							unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
							pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
						}
					}else{
						/* Generate a warning */
						unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
						pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
					}
				}
			}
			/* Update the pager state */
			pPager->iState = PAGER_READER;
			/* Invoke the xOpen methods if available */
			pMethods = pPager->pEngine->pIo->pMethods;
			if( pMethods->xOpen ){
				rc = pMethods->xOpen(pPager->pEngine,pPager->dbSize);
				if( rc != UNQLITE_OK ){
					unqliteGenErrorFormat(pPager->pDb,
						"xOpen() method of the underlying KV engine '%z' failed",
						&pPager->sKv
						);
					pager_unlock_db(pPager,NO_LOCK);
					pPager->iState = PAGER_OPEN;
					return rc;
				}
			}
		}else if( rc == UNQLITE_BUSY ){
			unqliteGenError(pPager->pDb,"Another process or thread have a reserved or exclusive lock on this database");
		}		
	}
	return rc;
}